

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O2

iterator * __thiscall
gmlc::containers::StableBlockVector<helics::Publication,_5U,_std::allocator<helics::Publication>_>::
end(iterator *__return_storage_ptr__,
   StableBlockVector<helics::Publication,_5U,_std::allocator<helics::Publication>_> *this)

{
  int iVar1;
  Publication **ppPVar2;
  Publication *pPVar3;
  
  iVar1 = this->bsize;
  ppPVar2 = this->dataptr;
  if ((long)iVar1 == 0x20) {
    if (ppPVar2 == (Publication **)0x0) {
      ppPVar2 = &end::emptyValue;
    }
    else {
      ppPVar2 = ppPVar2 + (long)this->dataSlotIndex + 1;
    }
    pPVar3 = *ppPVar2;
    iVar1 = 0;
  }
  else {
    ppPVar2 = ppPVar2 + this->dataSlotIndex;
    pPVar3 = *ppPVar2 + iVar1;
  }
  __return_storage_ptr__->vec = ppPVar2;
  __return_storage_ptr__->ptr = pPVar3;
  __return_storage_ptr__->offset = iVar1;
  return __return_storage_ptr__;
}

Assistant:

iterator end()
        {
            static X* emptyValue{nullptr};
            if (bsize == blockSize) {
                X** ptr = (dataptr != nullptr) ? &(dataptr[dataSlotIndex + 1]) :
                                                 &emptyValue;
                return {ptr, 0};
            }
            X** ptr = &(dataptr[dataSlotIndex]);
            return {ptr, bsize};
        }